

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::ModeAdd
          (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *this,idx_t row)

{
  ColumnDataScanState *pCVar1;
  size_t sVar2;
  int64_t iVar3;
  reference pvVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  hugeint_t *phVar7;
  ulong uVar8;
  key_type *__k;
  
  pCVar1 = this->scan;
  if ((pCVar1->next_row_index <= row) || (uVar5 = pCVar1->current_row_index, row < uVar5)) {
    duckdb::ColumnDataCollection::Seek
              ((ulong)this->inputs,(ColumnDataScanState *)row,(DataChunk *)pCVar1);
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    this->data = *(hugeint_t **)(pvVar4 + 0x20);
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    FlatVector::VerifyFlatVector(pvVar4);
    this->validity = (ValidityMask *)(pvVar4 + 0x28);
    uVar5 = this->scan->current_row_index;
  }
  __k = this->data + (uint)((int)row - (int)uVar5);
  pmVar6 = std::__detail::
           _Map_base<duckdb::hugeint_t,_std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::hugeint_t>,_std::hash<duckdb::hugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::hugeint_t,_std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::hugeint_t>,_std::hash<duckdb::hugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar2 = pmVar6->count;
  uVar5 = sVar2 + 1;
  pmVar6->count = uVar5;
  if (sVar2 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar6->first_row = row;
  }
  else {
    uVar8 = pmVar6->first_row;
    if (row < pmVar6->first_row) {
      uVar8 = row;
    }
    pmVar6->first_row = uVar8;
  }
  if (this->count < uVar5) {
    this->valid = true;
    this->count = uVar5;
    phVar7 = this->mode;
    if (phVar7 == (hugeint_t *)0x0) {
      phVar7 = (hugeint_t *)operator_new(0x10);
      iVar3 = __k->upper;
      phVar7->lower = __k->lower;
      phVar7->upper = iVar3;
      this->mode = phVar7;
    }
    else {
      iVar3 = __k->upper;
      phVar7->lower = __k->lower;
      phVar7->upper = iVar3;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}